

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_insert.cpp
# Opt level: O2

idx_t duckdb::HandleInsertConflicts<true>
                (TableCatalogEntry *table,ExecutionContext *context,InsertLocalState *lstate,
                InsertGlobalState *gstate,DataChunk *tuples,PhysicalInsert *op)

{
  DataChunk *pDVar1;
  ClientContext *context_00;
  data_ptr_t pdVar2;
  sel_t *__p;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  LocalStorage *this;
  optional_ptr<duckdb::LocalTableStorage,_true> storage;
  ConstraintState *pCVar5;
  idx_t iVar6;
  ManagedSelection *pMVar7;
  DuckTransaction *transaction;
  type state;
  TableCatalogEntry *table_01;
  reference pvVar8;
  reference pvVar9;
  const_reference pvVar10;
  TableDeleteState *state_00;
  type state_01;
  InternalException *this_00;
  element_type *count_p;
  idx_t i_1;
  ulong uVar11;
  optional_ptr<duckdb::ConflictManager,_true> manager;
  idx_t i_2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  allocator local_309;
  TableCatalogEntry *local_308;
  DataChunk *local_300;
  unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>
  fetch_state;
  SelectionVector sel_vec;
  SelectionVector local_2b0;
  SelectionVector *local_298;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_278;
  DataChunk combined_chunk;
  DataChunk conflict_condition_result;
  DataChunk conflict_chunk;
  DataChunk scan_chunk;
  string local_170;
  ConflictInfo conflict_info;
  ConflictManager conflict_manager;
  DataTable *table_00;
  undefined4 extraout_var_00;
  
  iVar4 = (*(table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry
            [0x10])();
  table_00 = (DataTable *)CONCAT44(extraout_var,iVar4);
  this = LocalStorage::Get(context->client,table_00->db);
  conflict_info.only_check_unique = true;
  local_300 = tuples;
  conflict_info.column_ids = &op->conflict_target;
  ConflictManager::ConflictManager(&conflict_manager,APPEND,tuples->count,&conflict_info);
  storage = LocalStorage::GetStorage(this,table_00);
  pCVar5 = InsertLocalState::GetConstraintState(lstate,table_00,table);
  manager.ptr = &conflict_manager;
  DataTable::VerifyAppendConstraints(table_00,pCVar5,context->client,local_300,storage,manager);
  ConflictManager::Finalize(&conflict_manager);
  iVar6 = ConflictManager::ConflictCount(&conflict_manager);
  if (iVar6 == 0) {
    p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    pMVar7 = ConflictManager::Conflicts(&conflict_manager);
    local_308 = (TableCatalogEntry *)ConflictManager::RowIds(&conflict_manager);
    DataChunk::DataChunk(&conflict_chunk);
    DataChunk::DataChunk(&scan_chunk);
    DataChunk::DataChunk(&combined_chunk);
    context_00 = context->client;
    DataChunk::GetTypes((vector<duckdb::LogicalType,_true> *)&sel_vec,local_300);
    DataChunk::Initialize
              (&conflict_chunk,context_00,(vector<duckdb::LogicalType,_true> *)&sel_vec,0x800);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&sel_vec);
    DataChunk::Reference(&conflict_chunk,local_300);
    local_278._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&pMVar7->sel_vec;
    DataChunk::Slice(&conflict_chunk,(SelectionVector *)local_278._M_pi,pMVar7->count);
    conflict_chunk.count = pMVar7->count;
    fetch_state.
    super_unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>_>._M_t.
    super___uniq_ptr_impl<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ColumnFetchState_*,_std::default_delete<duckdb::ColumnFetchState>_>
    .super__Head_base<0UL,_duckdb::ColumnFetchState_*,_false>._M_head_impl =
         (unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>_>)
         (__uniq_ptr_data<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true,_true>
          )0x0;
    if ((op->types_to_fetch).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
        .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (op->types_to_fetch).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
        .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      DataChunk::Initialize(&scan_chunk,context->client,&op->types_to_fetch,0x800);
      make_uniq<duckdb::ColumnFetchState>();
      __p = sel_vec.sel_vector;
      sel_vec.sel_vector = (sel_t *)0x0;
      ::std::
      __uniq_ptr_impl<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>_>::
      reset((__uniq_ptr_impl<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>_>
             *)&fetch_state,(pointer)__p);
      ::std::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>_>::
      ~unique_ptr((unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>_>
                   *)&sel_vec);
      transaction = DuckTransaction::Get
                              (context->client,
                               (table->super_StandardEntry).super_InCatalogEntry.catalog);
      manager.ptr = (ConflictManager *)pMVar7->count;
      state = unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>
              ::operator*(&fetch_state);
      DataTable::Fetch(table_00,transaction,&scan_chunk,&op->columns_to_fetch,(Vector *)local_308,
                       (idx_t)manager.ptr,state);
    }
    CombineExistingAndInsertTuples(&combined_chunk,&scan_chunk,&conflict_chunk,context->client,op);
    pCVar5 = InsertLocalState::GetConstraintState(lstate,table_00,table);
    if ((op->on_conflict_condition).
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl != (Expression *)0x0) {
      DataChunk::DataChunk(&conflict_condition_result);
      CheckOnConflictCondition
                (context,&combined_chunk,&op->on_conflict_condition,&conflict_condition_result);
      bVar3 = AllConflictsMeetCondition(&conflict_condition_result);
      if (!bVar3) {
        ManagedSelection::ManagedSelection((ManagedSelection *)&sel_vec,combined_chunk.count,true);
        pvVar8 = vector<duckdb::Vector,_true>::get<true>(&conflict_condition_result.data,0);
        pdVar2 = pvVar8->data;
        count_p = sel_vec.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        for (iVar6 = 0; combined_chunk.count != iVar6; iVar6 = iVar6 + 1) {
          if (pdVar2[iVar6] == '\0') {
            if (local_298 != (SelectionVector *)0x0) {
              *(int *)((long)&((((buffer_ptr<VectorBuffer> *)&local_298->sel_vector)->internal).
                               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->_vptr_VectorBuffer + (long)count_p * 4) = (int)iVar6;
            }
            count_p = (element_type *)((long)&(count_p->owned_data).allocator.ptr + 1);
            sel_vec.selection_data.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = count_p;
          }
        }
        DataChunk::Slice(&combined_chunk,&local_2b0,(idx_t)count_p);
        DataTable::VerifyAppendConstraints
                  (table_00,pCVar5,context->client,&combined_chunk,
                   (optional_ptr<duckdb::LocalTableStorage,_true>)0x0,
                   (optional_ptr<duckdb::ConflictManager,_true>)0x0);
        this_00 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_170,"VerifyAppendConstraints was expected to throw but didn\'t",
                   &local_309);
        InternalException::InternalException(this_00,&local_170);
        __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      DataChunk::~DataChunk(&conflict_condition_result);
    }
    if (&lstate->update_chunk == local_300) {
      RegisterUpdatedRows(lstate,(Vector *)local_308,combined_chunk.count);
    }
    if (op->action_type == NOTHING) {
      p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      DataChunk::DataChunk((DataChunk *)&sel_vec);
      CreateUpdateChunk(context,&combined_chunk,local_308,(Vector *)&sel_vec,(DataChunk *)op,
                        (PhysicalInsert *)manager.ptr);
      iVar4 = (*(table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
                _vptr_CatalogEntry[0x10])(table);
      table_01 = (TableCatalogEntry *)CONCAT44(extraout_var_00,iVar4);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b0.sel_vector ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        pDVar1 = &lstate->append_chunk;
        (lstate->append_chunk).count = (idx_t)local_2b0.sel_vector;
        for (uVar11 = 0;
            uVar11 < (ulong)(((long)(lstate->append_chunk).data.
                                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(lstate->append_chunk).data.
                                   super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                   super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x68);
            uVar11 = uVar11 + 1) {
          pvVar8 = vector<duckdb::Vector,_true>::get<true>(&pDVar1->data,uVar11);
          pvVar9 = vector<duckdb::Vector,_true>::get<true>(&combined_chunk.data,uVar11);
          Vector::Reference(pvVar8,pvVar9);
        }
        for (uVar11 = 0;
            uVar11 < (ulong)((long)(op->set_columns).
                                   super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                   .
                                   super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(op->set_columns).
                                   super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                   .
                                   super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3);
            uVar11 = uVar11 + 1) {
          pvVar10 = vector<duckdb::PhysicalIndex,_true>::get<true>(&op->set_columns,uVar11);
          pvVar8 = vector<duckdb::Vector,_true>::get<true>(&pDVar1->data,pvVar10->index);
          pvVar9 = vector<duckdb::Vector,_true>::get<true>
                             ((vector<duckdb::Vector,_true> *)&sel_vec,uVar11);
          Vector::Reference(pvVar8,pvVar9);
        }
        if (op->update_is_del_and_insert == false) {
          if ((op->parallel == false) && (op->return_chunk == true)) {
            ColumnDataCollection::Append(&gstate->return_collection,pDVar1);
          }
          DataTable::InitializeUpdate
                    ((DataTable *)&conflict_condition_result,table_01,(ClientContext *)table,
                     (vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
                      *)context->client);
          state_01 = unique_ptr<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>,_true>
                     ::operator*((unique_ptr<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>,_true>
                                  *)&conflict_condition_result);
          DataTable::Update((DataTable *)table_01,state_01,context->client,(Vector *)local_308,
                            &op->set_columns,(DataChunk *)&sel_vec);
          ::std::
          unique_ptr<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>_>::
          ~unique_ptr((unique_ptr<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>_>
                       *)&conflict_condition_result);
          p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b0.sel_vector;
        }
        else {
          state_00 = InsertLocalState::GetDeleteState
                               (lstate,(DataTable *)table_01,table,context->client);
          DataTable::Delete((DataTable *)table_01,state_00,context->client,(Vector *)local_308,
                            (idx_t)local_2b0.sel_vector);
          if ((op->parallel == false) && (op->return_chunk == true)) {
            ColumnDataCollection::Append(&gstate->return_collection,pDVar1);
          }
          DataTable::LocalAppend
                    ((DataTable *)table_01,table,context->client,pDVar1,&op->bound_constraints,
                     (Vector *)local_308,pDVar1);
          p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b0.sel_vector;
        }
      }
      DataChunk::~DataChunk((DataChunk *)&sel_vec);
    }
    pDVar1 = local_300;
    SelectionVector::SelectionVector(&sel_vec,local_300->count);
    iVar6 = SelectionVector::Inverted
                      ((SelectionVector *)local_278._M_pi,&sel_vec,pMVar7->count,pDVar1->count);
    DataChunk::Slice(pDVar1,&sel_vec,iVar6);
    pDVar1->count = iVar6;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&sel_vec.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ::std::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>_>::
    ~unique_ptr(&fetch_state.
                 super_unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>_>
               );
    DataChunk::~DataChunk(&combined_chunk);
    DataChunk::~DataChunk(&scan_chunk);
    DataChunk::~DataChunk(&conflict_chunk);
  }
  ConflictManager::~ConflictManager(&conflict_manager);
  return (idx_t)p_Var12;
}

Assistant:

static idx_t HandleInsertConflicts(TableCatalogEntry &table, ExecutionContext &context, InsertLocalState &lstate,
                                   InsertGlobalState &gstate, DataChunk &tuples, const PhysicalInsert &op) {
	auto &types_to_fetch = op.types_to_fetch;
	auto &on_conflict_condition = op.on_conflict_condition;
	auto &conflict_target = op.conflict_target;
	auto &columns_to_fetch = op.columns_to_fetch;
	auto &data_table = table.GetStorage();

	auto &local_storage = LocalStorage::Get(context.client, data_table.db);

	ConflictInfo conflict_info(conflict_target);
	ConflictManager conflict_manager(VerifyExistenceType::APPEND, tuples.size(), &conflict_info);
	auto storage = local_storage.GetStorage(data_table);
	if (GLOBAL) {
		auto &constraint_state = lstate.GetConstraintState(data_table, table);
		data_table.VerifyAppendConstraints(constraint_state, context.client, tuples, storage, &conflict_manager);
	} else {
		auto &indexes = local_storage.GetIndexes(context.client, data_table);
		DataTable::VerifyUniqueIndexes(indexes, storage, tuples, &conflict_manager);
	}

	conflict_manager.Finalize();
	if (conflict_manager.ConflictCount() == 0) {
		// No conflicts found, 0 updates performed
		return 0;
	}
	idx_t affected_tuples = 0;

	auto &conflicts = conflict_manager.Conflicts();
	auto &row_ids = conflict_manager.RowIds();

	DataChunk conflict_chunk; // contains only the conflicting values
	DataChunk scan_chunk;     // contains the original values, that caused the conflict
	DataChunk combined_chunk; // contains conflict_chunk + scan_chunk (wide)

	// Filter out everything but the conflicting rows
	conflict_chunk.Initialize(context.client, tuples.GetTypes());
	conflict_chunk.Reference(tuples);
	conflict_chunk.Slice(conflicts.Selection(), conflicts.Count());
	conflict_chunk.SetCardinality(conflicts.Count());

	// Holds the pins for the fetched rows
	unique_ptr<ColumnFetchState> fetch_state;
	if (!types_to_fetch.empty()) {
		D_ASSERT(scan_chunk.size() == 0);
		// When these values are required for the conditions or the SET expressions,
		// then we scan the existing table for the conflicting tuples, using the rowids
		scan_chunk.Initialize(context.client, types_to_fetch);
		fetch_state = make_uniq<ColumnFetchState>();
		if (GLOBAL) {
			auto &transaction = DuckTransaction::Get(context.client, table.catalog);
			data_table.Fetch(transaction, scan_chunk, columns_to_fetch, row_ids, conflicts.Count(), *fetch_state);
		} else {
			local_storage.FetchChunk(data_table, row_ids, conflicts.Count(), columns_to_fetch, scan_chunk,
			                         *fetch_state);
		}
	}

	// Splice the Input chunk and the fetched chunk together
	CombineExistingAndInsertTuples(combined_chunk, scan_chunk, conflict_chunk, context.client, op);

	auto &constraint_state = lstate.GetConstraintState(data_table, table);
	VerifyOnConflictCondition<GLOBAL>(context, combined_chunk, on_conflict_condition, constraint_state, tuples,
	                                  data_table, local_storage);

	if (&tuples == &lstate.update_chunk) {
		// Allow updating duplicate rows for the 'update_chunk'
		RegisterUpdatedRows(lstate, row_ids, combined_chunk.size());
	}

	affected_tuples += PerformOnConflictAction<GLOBAL>(lstate, gstate, context, combined_chunk, table, row_ids, op);

	// Remove the conflicting tuples from the insert chunk
	SelectionVector sel_vec(tuples.size());
	idx_t new_size = SelectionVector::Inverted(conflicts.Selection(), sel_vec, conflicts.Count(), tuples.size());
	tuples.Slice(sel_vec, new_size);
	tuples.SetCardinality(new_size);
	return affected_tuples;
}